

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# text_widgets.cpp
# Opt level: O3

bool check_max_min(Am_Value *result,Am_Object *widget,bool want_db)

{
  bool bVar1;
  uint uVar2;
  Am_Value *pAVar3;
  long mini;
  long maxi;
  ostream *poVar4;
  float minf;
  float maxf;
  Am_Value v2;
  Am_Value v1;
  Am_Value local_40;
  Am_Value local_30;
  
  pAVar3 = Am_Object::Get(widget,0x181,0);
  Am_Value::Am_Value(&local_30,pAVar3);
  pAVar3 = Am_Object::Get(widget,0x182,0);
  Am_Value::Am_Value(&local_40,pAVar3);
  if ((local_30.type == local_40.type) &&
     (((uVar2 = (uint)local_30.type, uVar2 < 6 && ((0x2dU >> (uVar2 & 0x1f) & 1) != 0)) ||
      (local_30.type == 0x8006)))) {
    if ((local_30.type & 0x8006) == 2) {
      mini = Am_Value::operator_cast_to_long(&local_30);
      maxi = Am_Value::operator_cast_to_long(&local_40);
      bVar1 = icheck_max_min(result,mini,maxi,want_db,widget);
    }
    else if ((uVar2 == 0x8006) || (bVar1 = true, uVar2 == 5)) {
      minf = Am_Value::operator_cast_to_float(&local_30);
      maxf = Am_Value::operator_cast_to_float(&local_40);
      bVar1 = fcheck_max_min(result,minf,maxf,want_db,widget);
    }
    Am_Value::~Am_Value(&local_40);
    Am_Value::~Am_Value(&local_30);
    return bVar1;
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"** Amulet_Error: ",0x11)
  ;
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cerr,"Am_VALUE_1 and Am_VALUE_2 of ",0x1d);
  poVar4 = operator<<((ostream *)&std::cerr,widget);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar4,
             " must be int, long, float, double, or Am_No_Value,  and the same type, but they are ",
             0x54);
  poVar4 = operator<<(poVar4,&local_30);
  std::__ostream_insert<char,std::char_traits<char>>(poVar4," and ",5);
  poVar4 = operator<<(poVar4,&local_40);
  std::endl<char,std::char_traits<char>>(poVar4);
  Am_Error();
}

Assistant:

bool
check_max_min(Am_Value result, Am_Object &widget, bool want_db)
{
  Am_Value v1 = widget.Get(Am_VALUE_1);
  Am_Value v2 = widget.Get(Am_VALUE_2);
  if (!(v1.type == v2.type &&
        (v1.type == Am_FLOAT || v1.type == Am_LONG || v1.type == Am_DOUBLE ||
         v1.type == Am_INT || v1.type == Am_NONE)))
    Am_ERRORO("Am_VALUE_1 and Am_VALUE_2 of "
                  << widget
                  << " must be int, long, float, double, or Am_No_Value, "
                     " and the same type, but they are "
                  << v1 << " and " << v2,
              widget, Am_VALUE_1);
  if (v1.type == Am_LONG || v1.type == Am_INT)
    return icheck_max_min(result, v1, v2, want_db, widget);
  else if (v1.type == Am_FLOAT || v1.type == Am_DOUBLE)
    return fcheck_max_min(result, v1, v2, want_db, widget);
  return true;
}